

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O3

void GraphTask::add_edge_features(search *sch,task_data *D,size_t n,multi_ex *ec)

{
  pointer pvVar1;
  pointer puVar2;
  unsigned_long uVar3;
  example *peVar4;
  unsigned_long uVar5;
  vw *pvVar6;
  ulong uVar7;
  long lVar8;
  pointer ppeVar9;
  char cVar10;
  pointer puVar11;
  ulong uVar12;
  wclass *pwVar14;
  long lVar15;
  ulong uVar16;
  char cVar17;
  uint32_t *puVar18;
  uint uVar19;
  size_t sVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  wclass *pwVar13;
  
  D->cur_node = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[n];
  pvVar1 = (D->adj).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = pvVar1[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            ((long)&pvVar1[n].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  do {
    if (puVar11 == puVar2) {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)
                 (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[n],&neighbor_namespace);
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n];
      peVar4->total_sum_feat_sq =
           *(float *)((long)((peVar4->super_example_predict).feature_space + 0x83) + 0x60) +
           peVar4->total_sum_feat_sq;
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[n];
      peVar4->num_features =
           peVar4->num_features +
           ((long)*(float **)((long)((peVar4->super_example_predict).feature_space + 0x83) + 8) -
            (long)(peVar4->super_example_predict).feature_space[0x83].values._begin >> 2);
      Search::search::get_vw_pointer_unsafe(sch);
      return;
    }
    uVar3 = *puVar11;
    if (D->numN != 0) {
      uVar7 = 0;
      do {
        D->neighbor_predictions[uVar7] = 0.0;
        uVar7 = uVar7 + 1;
      } while (uVar7 < D->numN);
    }
    if (D->use_structure == false) {
      *D->neighbor_predictions = *D->neighbor_predictions + 1.0;
      fVar23 = 0.0;
      fVar22 = 1.0;
LAB_002693c2:
      if (D->numN != 0) {
        uVar7 = 0;
        do {
          D->neighbor_predictions[uVar7] = D->neighbor_predictions[uVar7] / fVar22;
          uVar7 = uVar7 + 1;
        } while (uVar7 < D->numN);
      }
      peVar4 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      if (fVar22 <= 1.0) {
        *D->neighbor_predictions = fVar23;
        pvVar6 = Search::search::get_vw_pointer_unsafe(sch);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_single_fn>
                  (pvVar6,peVar4,D);
      }
      else {
        pvVar6 = Search::search::get_vw_pointer_unsafe(sch);
        GD::
        foreach_feature<GraphTask::task_data,_unsigned_long,_&GraphTask::add_edge_features_group_fn>
                  (pvVar6,peVar4,D);
      }
    }
    else {
      ppeVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      peVar4 = ppeVar9[uVar3];
      if (D->directed == false) {
        pwVar13 = (peVar4->l).cs.costs._begin;
        pwVar14 = (peVar4->l).cs.costs._end;
        uVar7 = (long)pwVar14 - (long)pwVar13 >> 4;
        cVar10 = '\x01';
      }
      else {
        pwVar13 = (peVar4->l).cs.costs._begin;
        pwVar14 = (peVar4->l).cs.costs._end;
        uVar7 = (long)pwVar14 - (long)pwVar13 >> 4;
        if (uVar7 == 1) {
          uVar7 = 1;
          cVar10 = '\x01';
        }
        else {
          puVar18 = &pwVar13->class_index;
          uVar16 = 1;
          cVar10 = '\x01';
          do {
            sVar20 = (ulong)*puVar18 - 1;
            cVar17 = '\0';
            if (sVar20 != n) {
              cVar17 = cVar10;
            }
            if ((*puVar18 == 0) || (cVar10 = cVar17, sVar20 == n)) break;
            puVar18 = puVar18 + 4;
            bVar21 = uVar16 < uVar7 - 1;
            uVar16 = uVar16 + 1;
          } while (bVar21);
        }
      }
      if (pwVar14 != pwVar13) {
        uVar19 = 0;
        fVar22 = 0.0;
        lVar15 = 4;
        cVar17 = '\0';
        uVar16 = 0;
        do {
          uVar12 = (ulong)*(uint *)((long)&pwVar13->x + lVar15);
          if (uVar12 == 0) {
            cVar17 = '\x01';
          }
          else {
            if (uVar16 == uVar7 - 1) {
              cVar17 = '\x01';
            }
            if (uVar12 - 1 != n) {
              if ((D->directed == true) && (cVar10 != cVar17)) {
                lVar8 = D->K + 1;
              }
              else {
                lVar8 = 0;
              }
              uVar5 = (D->pred).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar12 - 1];
              D->neighbor_predictions[uVar5 + lVar8 + -1] =
                   D->neighbor_predictions[uVar5 + lVar8 + -1] + 1.0;
              fVar22 = fVar22 + 1.0;
              uVar19 = ((int)lVar8 +
                       (int)(D->pred).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]) - 1;
              ppeVar9 = (ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                        super__Vector_impl_data._M_start;
            }
          }
          uVar16 = uVar16 + 1;
          pwVar13 = (ppeVar9[uVar3]->l).cs.costs._begin;
          uVar7 = (long)(ppeVar9[uVar3]->l).cs.costs._end - (long)pwVar13 >> 4;
          lVar15 = lVar15 + 0x10;
        } while (uVar16 < uVar7);
        if ((fVar22 != 0.0) || (NAN(fVar22))) {
          fVar23 = (float)uVar19;
          goto LAB_002693c2;
        }
      }
    }
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

void add_edge_features(Search::search& sch, task_data& D, size_t n, multi_ex& ec)
{
  D.cur_node = ec[n];

  for (size_t i : D.adj[n])
  {
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] = 0.;

    float pred_total = 0.;
    uint32_t last_pred = 0;
    if (D.use_structure)
    {
      bool n_in_sink = true;
      if (D.directed)
        for (size_t j = 0; j < ec[i]->l.cs.costs.size() - 1; j++)
        {
          size_t m = ec[i]->l.cs.costs[j].class_index;
          if (m == 0)
            break;
          if (m - 1 == n)
          {
            n_in_sink = false;
            break;
          }
        }

      bool m_in_sink = false;
      for (size_t j = 0; j < ec[i]->l.cs.costs.size(); j++)
      {
        size_t m = ec[i]->l.cs.costs[j].class_index;
        if (m == 0)
        {
          m_in_sink = true;
          continue;
        }
        if (j == ec[i]->l.cs.costs.size() - 1)
          m_in_sink = true;
        m--;
        if (m == n)
          continue;
        size_t other_side = (D.directed && (n_in_sink != m_in_sink)) ? (D.K + 1) : 0;
        D.neighbor_predictions[D.pred[m] - 1 + other_side] += 1.;
        pred_total += 1.;
        last_pred = (uint32_t)D.pred[m] - 1 + (uint32_t)other_side;
      }
    }
    else
    {
      D.neighbor_predictions[0] += 1.;
      pred_total += 1.;
      last_pred = 0;
    }

    if (pred_total == 0.)
      continue;
    // cerr << n << ':' << i << " -> ["; for (size_t k=0; k<D.numN; k++) cerr << ' ' << D.neighbor_predictions[k]; cerr
    // << " ]" << endl;
    for (size_t k = 0; k < D.numN; k++) D.neighbor_predictions[k] /= pred_total;
    example& edge = *ec[i];

    if (pred_total <= 1.)  // single edge
    {
      D.neighbor_predictions[0] = (float)last_pred;
      GD::foreach_feature<task_data, uint64_t, add_edge_features_single_fn>(sch.get_vw_pointer_unsafe(), edge, D);
    }
    else  // lots of edges
      GD::foreach_feature<task_data, uint64_t, add_edge_features_group_fn>(sch.get_vw_pointer_unsafe(), edge, D);
  }
  ec[n]->indices.push_back(neighbor_namespace);
  ec[n]->total_sum_feat_sq += ec[n]->feature_space[neighbor_namespace].sum_feat_sq;
  ec[n]->num_features += ec[n]->feature_space[neighbor_namespace].size();

  vw& all = sch.get_vw_pointer_unsafe();
  for (string& i : all.pairs)
  {
    int i0 = (int)i[0];
    int i1 = (int)i[1];
    if ((i0 == (int)neighbor_namespace) || (i1 == (int)neighbor_namespace))
    {
      ec[n]->num_features += ec[n]->feature_space[i0].size() * ec[n]->feature_space[i1].size();
      ec[n]->total_sum_feat_sq += ec[n]->feature_space[i0].sum_feat_sq * ec[n]->feature_space[i1].sum_feat_sq;
    }
  }
}